

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# project.cpp
# Opt level: O0

ProStringList * prepareBuiltinArgs(QList<ProStringList> *args)

{
  bool bVar1;
  const_iterator o;
  ProString *this;
  QList<ProStringList> *in_RSI;
  ProStringList *in_RDI;
  long in_FS_OFFSET;
  ProStringList *arg;
  QList<ProStringList> *__range1;
  ProStringList *ret;
  const_iterator __end1;
  const_iterator __begin1;
  ProString *in_stack_ffffffffffffff48;
  QList<ProStringList> *in_stack_ffffffffffffff50;
  undefined7 in_stack_ffffffffffffff78;
  undefined1 uVar2;
  QChar local_6a [17];
  qsizetype in_stack_ffffffffffffffb8;
  const_iterator local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  uVar2 = 0;
  (in_RDI->super_QList<ProString>).d.d = (Data *)0xaaaaaaaaaaaaaaaa;
  (in_RDI->super_QList<ProString>).d.ptr = (ProString *)0xaaaaaaaaaaaaaaaa;
  (in_RDI->super_QList<ProString>).d.size = -0x5555555555555556;
  ProStringList::ProStringList((ProStringList *)0x32d089);
  QList<ProStringList>::size(in_RSI);
  QList<ProString>::reserve
            ((QList<ProString> *)CONCAT17(uVar2,in_stack_ffffffffffffff78),in_stack_ffffffffffffffb8
            );
  local_10.i = (ProStringList *)0xaaaaaaaaaaaaaaaa;
  local_10 = QList<ProStringList>::begin(in_stack_ffffffffffffff50);
  o = QList<ProStringList>::end(in_stack_ffffffffffffff50);
  while (bVar1 = QList<ProStringList>::const_iterator::operator!=(&local_10,o), bVar1) {
    this = (ProString *)QList<ProStringList>::const_iterator::operator*(&local_10);
    QChar::QChar<char,_true>(local_6a,' ');
    ProStringList::join((ProStringList *)in_stack_ffffffffffffff48,
                        (QChar)(char16_t)((ulong)in_RDI >> 0x30));
    ProString::ProString(this,&in_stack_ffffffffffffff48->m_string);
    ProStringList::operator<<((ProStringList *)this,in_stack_ffffffffffffff48);
    ProString::~ProString((ProString *)0x32d19f);
    QString::~QString((QString *)0x32d1a9);
    QList<ProStringList>::const_iterator::operator++(&local_10);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

static ProStringList prepareBuiltinArgs(const QList<ProStringList> &args)
{
    ProStringList ret;
    ret.reserve(args.size());
    for (const ProStringList &arg : args)
        ret << arg.join(' ');
    return ret;
}